

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O0

void __thiscall Centaurus::DFAState<char>::print(DFAState<char> *this,wostream *os,int from)

{
  bool bVar1;
  int iVar2;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *this_00;
  reference this_01;
  wostream *pwVar3;
  CharClass<char> *cc;
  NFATransition<char> *t;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__range2
  ;
  int from_local;
  wostream *os_local;
  DFAState<char> *this_local;
  
  this_00 = &(this->super_NFABaseState<char,_Centaurus::IndexVector>).m_transitions;
  __end0 = std::
           vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ::begin(this_00);
  t = (NFATransition<char> *)
      std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
      ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                                *)&t);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
              ::operator*(&__end0);
    pwVar3 = std::operator<<(os,L"S");
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,from);
    pwVar3 = std::operator<<(pwVar3,L" -> ");
    pwVar3 = std::operator<<(pwVar3,L"S");
    iVar2 = NFATransition<char>::dest(this_01);
    pwVar3 = (wostream *)std::wostream::operator<<(pwVar3,iVar2);
    std::operator<<(pwVar3,L" [ label=\"");
    cc = NFATransition<char>::label(this_01);
    Centaurus::operator<<(os,cc);
    pwVar3 = std::operator<<(os,L"\" ];");
    std::wostream::operator<<(pwVar3,std::endl<wchar_t,std::char_traits<wchar_t>>);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

virtual void print(std::wostream& os, int from) const override
	{
		for (const auto& t : m_transitions)
		{
			os << L"S" << from << L" -> " << L"S" << t.dest() << L" [ label=\"";
			os << t.label();
			os << L"\" ];" << std::endl;
		}
	}